

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O0

void __thiscall Enterprise::Nick::output_pixel<2,false>(Nick *this,uint16_t *target,int columns)

{
  byte bVar1;
  byte bVar2;
  int local_24;
  int iStack_20;
  uint8_t pixels [2];
  int c;
  int index;
  int columns_local;
  uint16_t *target_local;
  Nick *this_local;
  
  iStack_20 = 0;
  _index = target;
  for (local_24 = 0; local_24 < columns; local_24 = local_24 + 1) {
    bVar1 = this->ram_[(int)((uint)this->line_data_pointer_[0] + iStack_20 & 0xffff)];
    bVar2 = this->ram_[(int)((uint)this->line_data_pointer_[0] + iStack_20 + 1 & 0xffff)];
    iStack_20 = iStack_20 + 2;
    this->last_read_ = bVar2;
    *_index = this->palette_[(int)(bVar1 & 0x80) >> 7 | (int)(bVar1 & 8) >> 2];
    _index[1] = this->palette_[(int)(bVar1 & 0x40) >> 6 | (int)(bVar1 & 4) >> 1];
    _index[2] = this->palette_[(int)((int)(bVar1 & 0x20) >> 5 | bVar1 & 2)];
    _index[3] = this->palette_[(int)((int)(bVar1 & 0x10) >> 4 | (bVar1 & 1) << 1)];
    _index[4] = this->palette_[(int)(bVar2 & 0x80) >> 7 | (int)(bVar2 & 8) >> 2];
    _index[5] = this->palette_[(int)(bVar2 & 0x40) >> 6 | (int)(bVar2 & 4) >> 1];
    _index[6] = this->palette_[(int)((int)(bVar2 & 0x20) >> 5 | bVar2 & 2)];
    _index[7] = this->palette_[(int)((int)(bVar2 & 0x10) >> 4 | (bVar2 & 1) << 1)];
    _index = _index + 8;
  }
  return;
}

Assistant:

void Nick::output_pixel(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	int index = 0;
	for(int c = 0; c < columns; c++) {
		uint8_t pixels[2] = {
			ram_[(line_data_pointer_[0] + index) & 0xffff],
			ram_[(line_data_pointer_[0] + index + 1) & 0xffff]
		};
		index += is_lpixel ? 1 : 2;
		last_read_ = pixels[1];

		switch(bpp) {
			default:
			case 1: {
				const uint16_t *palette = alt_ind_palettes[((pixels[0] >> 6) & 0x02) | (pixels[0]&1)];
				pixels[0] &= two_colour_mask_;
				output1bpp(pixels[0]);

				if constexpr (!is_lpixel) {
					palette = alt_ind_palettes[((pixels[1] >> 6) & 0x02) | (pixels[1]&1)];
					pixels[1] &= two_colour_mask_;
					output1bpp(pixels[1]);
				}
			} break;

			case 2:
				output2bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output2bpp(pixels[1]);
				}
			break;

			case 4:
				output4bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output4bpp(pixels[1]);
				}
			break;

			case 8:
				output8bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output8bpp(pixels[1]);
				}
			break;
		}
	}
}